

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_54(QPDF *pdf,char *arg2)

{
  bool bVar1;
  ostream *poVar2;
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  QPDFWriter local_28 [8];
  QPDFWriter w;
  char *arg2_local;
  QPDF *pdf_local;
  
  QPDFWriter::QPDFWriter(local_28,pdf,"a.pdf");
  QPDF::getPDFVersion_abi_cxx11_();
  bVar1 = std::operator!=(&local_48,"1.5");
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_48);
    QPDFWriter::setObjectStreamMode((qpdf_object_stream_e)local_28);
    QPDFWriter::getFinalVersion_abi_cxx11_();
    bVar1 = std::operator!=(&local_78,"1.5");
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"oops: ");
      QPDFWriter::getFinalVersion_abi_cxx11_();
      poVar2 = std::operator<<(poVar2,local_98);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_98);
    }
    QPDFWriter::~QPDFWriter(local_28);
    return;
  }
  __assert_fail("pdf.getPDFVersion() != \"1.5\"",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x814,"void test_54(QPDF &, const char *)");
}

Assistant:

static void
test_54(QPDF& pdf, char const* arg2)
{
    // Test getFinalVersion. This must be invoked with a file
    // whose final version is not 1.5.
    QPDFWriter w(pdf, "a.pdf");
    assert(pdf.getPDFVersion() != "1.5");
    w.setObjectStreamMode(qpdf_o_generate);
    if (w.getFinalVersion() != "1.5") {
        std::cout << "oops: " << w.getFinalVersion() << std::endl;
    }
}